

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageBrightness(gdImagePtr src,int brightness)

{
  uint uVar1;
  int color;
  code *pcVar2;
  uint uVar3;
  int g;
  int y;
  uint uVar4;
  int b;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar5 = 0;
  if ((0xfffffe00 < brightness - 0x100U && src != (gdImagePtr)0x0) && (iVar5 = 1, brightness != 0))
  {
    if (src->trueColor == 0) {
      pcVar2 = gdImageGetPixel;
    }
    else {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    iVar5 = src->sy;
    if (0 < iVar5) {
      iVar7 = src->sx;
      y = 0;
      do {
        if (0 < iVar7) {
          iVar5 = 0;
          do {
            uVar1 = (*pcVar2)(src,iVar5,y);
            if (src->trueColor == 0) {
              uVar6 = src->red[(int)uVar1];
              uVar3 = src->green[(int)uVar1];
              uVar4 = src->blue[(int)uVar1];
              uVar1 = src->alpha[(int)uVar1];
            }
            else {
              uVar6 = uVar1 >> 0x10 & 0xff;
              uVar3 = uVar1 >> 8 & 0xff;
              uVar4 = uVar1 & 0xff;
              uVar1 = uVar1 >> 0x18 & 0x7f;
            }
            iVar7 = uVar6 + brightness;
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            g = uVar3 + brightness;
            if (g < 1) {
              g = 0;
            }
            if (0xfe < g) {
              g = 0xff;
            }
            b = uVar4 + brightness;
            if (b < 1) {
              b = 0;
            }
            if (0xfe < b) {
              b = 0xff;
            }
            color = gdImageColorAllocateAlpha(src,iVar7,g,b,uVar1);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,iVar7,g,b,uVar1);
            }
            gdImageSetPixel(src,iVar5,y,color);
            iVar5 = iVar5 + 1;
            iVar7 = src->sx;
          } while (iVar5 < iVar7);
          iVar5 = src->sy;
        }
        y = y + 1;
      } while (y < iVar5);
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

BGD_DECLARE(int) gdImageBrightness(gdImagePtr src, int brightness)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL || (brightness < -255 || brightness > 255)) {
		return 0;
	}

	if (brightness==0) {
		return 1;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			r = r + brightness;
			g = g + brightness;
			b = b + brightness;

			r = (r > 255)? 255 : ((r < 0)? 0:r);
			g = (g > 255)? 255 : ((g < 0)? 0:g);
			b = (b > 255)? 255 : ((b < 0)? 0:b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)r, (int)g, (int)b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)r, (int)g, (int)b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}